

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O3

double __thiscall icu_63::numparse::impl::ParsedNumber::getDouble(ParsedNumber *this)

{
  uint uVar1;
  bool bVar2;
  int64_t iVar3;
  double dVar4;
  
  uVar1 = this->flags;
  if ((uVar1 & 0x40) != 0) {
    dVar4 = uprv_getNaN_63();
    return dVar4;
  }
  if ((char)uVar1 < '\0') {
    dVar4 = *(double *)(&DAT_002f7d28 + (ulong)((uVar1 & 1) == 0) * 8);
  }
  else {
    bVar2 = icu_63::number::impl::DecimalQuantity::isZero(&this->quantity);
    if ((bVar2) &&
       (bVar2 = icu_63::number::impl::DecimalQuantity::isNegative(&this->quantity), bVar2)) {
      return -0.0;
    }
    bVar2 = icu_63::number::impl::DecimalQuantity::fitsInLong(&this->quantity,false);
    if (!bVar2) {
      dVar4 = icu_63::number::impl::DecimalQuantity::toDouble(&this->quantity);
      return dVar4;
    }
    iVar3 = icu_63::number::impl::DecimalQuantity::toLong(&this->quantity,false);
    dVar4 = (double)iVar3;
  }
  return dVar4;
}

Assistant:

double ParsedNumber::getDouble() const {
    bool sawNaN = 0 != (flags & FLAG_NAN);
    bool sawInfinity = 0 != (flags & FLAG_INFINITY);

    // Check for NaN, infinity, and -0.0
    if (sawNaN) {
        // Can't use NAN or std::nan because the byte pattern is platform-dependent;
        // MSVC sets the sign bit, but Clang and GCC do not
        return uprv_getNaN();
    }
    if (sawInfinity) {
        if (0 != (flags & FLAG_NEGATIVE)) {
            return -INFINITY;
        } else {
            return INFINITY;
        }
    }
    U_ASSERT(!quantity.bogus);
    if (quantity.isZero() && quantity.isNegative()) {
        return -0.0;
    }

    if (quantity.fitsInLong()) {
        return static_cast<double>(quantity.toLong());
    } else {
        return quantity.toDouble();
    }
}